

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O0

Offset<void> __thiscall
UnionUnderlyingType::ABCUnion::Pack
          (ABCUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  ABC AVar1;
  Offset<UnionUnderlyingType::C> local_54;
  CT *local_50;
  CT *ptr_2;
  BT *local_40;
  BT *ptr_1;
  AT *local_30;
  AT *ptr;
  rehasher_function_t *_rehasher_local;
  FlatBufferBuilder *_fbb_local;
  ABCUnion *this_local;
  
  AVar1 = this->type;
  ptr = (AT *)_rehasher;
  _rehasher_local = (rehasher_function_t *)_fbb;
  _fbb_local = (FlatBufferBuilder *)this;
  if (AVar1 == A) {
    local_30 = (AT *)this->value;
    ptr_1._4_4_ = CreateA(_fbb,local_30,_rehasher);
    this_local._4_4_ =
         flatbuffers::Offset<UnionUnderlyingType::A>::Union
                   ((Offset<UnionUnderlyingType::A> *)((long)&ptr_1 + 4));
  }
  else if (AVar1 == B) {
    local_40 = (BT *)this->value;
    ptr_2._4_4_ = CreateB(_fbb,local_40,_rehasher);
    this_local._4_4_ =
         flatbuffers::Offset<UnionUnderlyingType::B>::Union
                   ((Offset<UnionUnderlyingType::B> *)((long)&ptr_2 + 4));
  }
  else if (AVar1 == C) {
    local_50 = (CT *)this->value;
    local_54 = CreateC(_fbb,local_50,_rehasher);
    this_local._4_4_ = flatbuffers::Offset<UnionUnderlyingType::C>::Union(&local_54);
  }
  else {
    flatbuffers::Offset<void>::Offset((Offset<void> *)((long)&this_local + 4),0);
  }
  return (Offset<void>)this_local._4_4_;
}

Assistant:

inline ::flatbuffers::Offset<void> ABCUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case ABC::A: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::AT *>(value);
      return CreateA(_fbb, ptr, _rehasher).Union();
    }
    case ABC::B: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::BT *>(value);
      return CreateB(_fbb, ptr, _rehasher).Union();
    }
    case ABC::C: {
      auto ptr = reinterpret_cast<const UnionUnderlyingType::CT *>(value);
      return CreateC(_fbb, ptr, _rehasher).Union();
    }
    default: return 0;
  }
}